

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_predictor_base.h
# Opt level: O2

VectorD<long,_3> * __thiscall
draco::
MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::GetPositionForDataId
          (VectorD<long,_3> *__return_storage_ptr__,
          MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
          *this,int data_id)

{
  AttributeValueIndex att_index;
  
  att_index.value_ = this->entry_to_point_id_map_[data_id].value_;
  if (this->pos_attribute_->identity_mapping_ == false) {
    att_index.value_ =
         (this->pos_attribute_->indices_map_).vector_.
         super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[att_index.value_].value_;
  }
  VectorD<long,_3>::VectorD(__return_storage_ptr__);
  GeometryAttribute::ConvertValue<long>
            (&this->pos_attribute_->super_GeometryAttribute,att_index,(long *)__return_storage_ptr__
            );
  return __return_storage_ptr__;
}

Assistant:

VectorD<int64_t, 3> GetPositionForDataId(int data_id) const {
    DRACO_DCHECK(this->IsInitialized());
    const auto point_id = entry_to_point_id_map_[data_id];
    const auto pos_val_id = pos_attribute_->mapped_index(point_id);
    VectorD<int64_t, 3> pos;
    pos_attribute_->ConvertValue(pos_val_id, &pos[0]);
    return pos;
  }